

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

void __thiscall
draco::Mesh::ApplyPointIdDeduplication
          (Mesh *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
          *id_map,vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *unique_point_ids)

{
  pointer pIVar1;
  pointer paVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  PointCloud::ApplyPointIdDeduplication(&this->super_PointCloud,id_map,unique_point_ids);
  paVar2 = (this->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 2) *
          -0x5555555555555555;
  if ((int)uVar3 != 0) {
    pIVar1 = (id_map->vector_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        paVar2->_M_elems[lVar5].value_ = pIVar1[paVar2->_M_elems[lVar5].value_].value_;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar4 = uVar4 + 1;
      paVar2 = paVar2 + 1;
    } while (uVar4 != (uVar3 & 0xffffffff));
  }
  return;
}

Assistant:

void Mesh::ApplyPointIdDeduplication(
    const IndexTypeVector<PointIndex, PointIndex> &id_map,
    const std::vector<PointIndex> &unique_point_ids) {
  PointCloud::ApplyPointIdDeduplication(id_map, unique_point_ids);
  for (FaceIndex f(0); f < num_faces(); ++f) {
    for (int32_t c = 0; c < 3; ++c) {
      faces_[f][c] = id_map[faces_[f][c]];
    }
  }
}